

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_dbda26::GetIndexArg(string *arg,int *idx,cmMakefile *mf)

{
  bool bVar1;
  PolicyStatus PVar2;
  PolicyID id;
  string local_c0;
  undefined1 local_a0 [8];
  string msg;
  string local_70;
  undefined1 local_50 [8];
  string warn;
  long value;
  cmMakefile *mf_local;
  int *idx_local;
  string *arg_local;
  
  bVar1 = cmStrToLong(arg,(long *)(warn.field_2._M_local_buf + 8));
  if (!bVar1) {
    PVar2 = cmMakefile::GetPolicyStatus(mf,CMP0121,false);
    switch(PVar2) {
    case WARN:
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_70,(cmPolicies *)0x79,id);
      cmStrCat<std::__cxx11::string,char_const(&)[22],std::__cxx11::string_const&,char_const(&)[3]>
                ((string *)local_50,&local_70,(char (*) [22])" Invalid list index \"",arg,
                 (char (*) [3])0x111e91e);
      std::__cxx11::string::~string((string *)&local_70);
      cmMakefile::IssueMessage(mf,AUTHOR_WARNING,(string *)local_50);
      std::__cxx11::string::~string((string *)local_50);
    case OLD:
      break;
    case NEW:
      return false;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_c0,(cmPolicies *)0x79,id);
      cmStrCat<std::__cxx11::string,char_const(&)[22],std::__cxx11::string_const&,char_const(&)[3]>
                ((string *)local_a0,&local_c0,(char (*) [22])" Invalid list index \"",arg,
                 (char (*) [3])0x111e91e);
      std::__cxx11::string::~string((string *)&local_c0);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_a0);
      std::__cxx11::string::~string((string *)local_a0);
    }
  }
  *idx = warn.field_2._8_4_;
  return true;
}

Assistant:

bool GetIndexArg(const std::string& arg, int* idx, cmMakefile& mf)
{
  long value;
  if (!cmStrToLong(arg, &value)) {
    switch (mf.GetPolicyStatus(cmPolicies::CMP0121)) {
      case cmPolicies::WARN: {
        // Default is to warn and use old behavior OLD behavior is to allow
        // compatibility, so issue a warning and use the previous behavior.
        std::string warn =
          cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0121),
                   " Invalid list index \"", arg, "\".");
        mf.IssueMessage(MessageType::AUTHOR_WARNING, warn);
        CM_FALLTHROUGH;
      }
      case cmPolicies::OLD:
        // OLD behavior is to allow compatibility, so just ignore the
        // situation.
        break;
      case cmPolicies::NEW:
        return false;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        std::string msg =
          cmStrCat(cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0121),
                   " Invalid list index \"", arg, "\".");
        mf.IssueMessage(MessageType::FATAL_ERROR, msg);
        break;
    }
  }

  // Truncation is happening here, but it had always been happening here.
  *idx = static_cast<int>(value);

  return true;
}